

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geom3d.c
# Opt level: O1

double v3dihedral(point3d *p1,point3d *p2,point3d *p3,point3d *p4)

{
  double dVar1;
  undefined4 uVar2;
  uint uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  dVar9 = p2->x;
  dVar10 = p2->y;
  dVar4 = p1->x - dVar9;
  dVar6 = p1->y - dVar10;
  dVar12 = p2->z;
  dVar11 = p1->z - dVar12;
  dVar5 = p3->x;
  dVar7 = p3->y;
  dVar13 = p3->z;
  dVar8 = dVar6 * (dVar13 - dVar12) - (dVar7 - dVar10) * dVar11;
  dVar11 = dVar11 * (dVar5 - dVar9) - (dVar13 - dVar12) * dVar4;
  dVar6 = (dVar7 - dVar10) * dVar4 - (dVar5 - dVar9) * dVar6;
  dVar9 = dVar9 - dVar5;
  dVar10 = dVar10 - dVar7;
  dVar12 = dVar12 - dVar13;
  dVar5 = p4->x - dVar5;
  dVar7 = p4->y - dVar7;
  dVar13 = p4->z - dVar13;
  dVar4 = dVar10 * dVar13 - dVar7 * dVar12;
  dVar13 = dVar12 * dVar5 - dVar13 * dVar9;
  dVar7 = dVar9 * dVar7 - dVar5 * dVar10;
  dVar5 = dVar6 * dVar6 + dVar8 * dVar8 + dVar11 * dVar11;
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  dVar1 = dVar7 * dVar7 + dVar4 * dVar4 + dVar13 * dVar13;
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  uVar2 = 0;
  uVar3 = 0;
  if (0.0001 <= dVar5 * dVar1) {
    dVar5 = acos((dVar6 * dVar7 + dVar8 * dVar4 + dVar11 * dVar13) / (dVar5 * dVar1));
    uVar2 = SUB84(dVar5,0);
    uVar3 = (uint)((ulong)dVar5 >> 0x20);
  }
  dVar5 = dVar11 * dVar12 - dVar10 * dVar6;
  dVar12 = dVar6 * dVar9 - dVar12 * dVar8;
  dVar10 = dVar8 * dVar10 - dVar9 * dVar11;
  dVar9 = dVar10 * dVar10 + dVar5 * dVar5 + dVar12 * dVar12;
  if (dVar9 < 0.0) {
    dVar9 = sqrt(dVar9);
  }
  else {
    dVar9 = SQRT(dVar9);
  }
  if ((0.0001 <= dVar1 * dVar9) &&
     (dVar9 = acos((dVar10 * dVar7 + dVar5 * dVar4 + dVar12 * dVar13) / (dVar1 * dVar9)),
     90.0 < dVar9 * 57.29578)) {
    uVar3 = uVar3 ^ 0x80000000;
  }
  return (double)CONCAT44(uVar3,uVar2);
}

Assistant:

double  v3dihedral(point3d* p1, point3d* p2, point3d* p3, point3d* p4) {
	vector3d a, b, c, d, e, f;
	double dmag, emag, fmag, theta, phi;

	v3cross(v3sub(p1, p2, &a), v3sub(p3, p2, &b), &d);
	v3cross(v3sub(p2, p3, &b), v3sub(p4, p3, &c), &e);
	dmag = v3length(&d);
	emag = v3length(&e);

	if (dmag*emag < 0.0001) { theta = 0.0; }
	else { theta = acos(v3dot(&d, &e)/(dmag*emag)); }

	v3cross(&d, &b, &f); /* this part sets the correct handedness */
	fmag = v3length(&f);
	if (fmag*emag < 0.0001) { phi = 0.0; }
	else { phi = acos(v3dot(&f, &e)/(fmag*emag)); }

	if (phi*RAD2DEG > 90.0) { theta = - theta; };

	return(theta);
}